

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *this;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  ImU32 IVar9;
  float fVar10;
  float fVar11;
  bool held;
  bool hovered;
  ImRect bb;
  bool local_92;
  bool local_91;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  ImVec4 local_68;
  ImVec2 local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImRect local_38;
  
  pIVar2 = GImGui->CurrentWindow;
  local_48 = (*pos).x;
  fStack_44 = (*pos).y;
  local_88 = local_48 - radius;
  fStack_84 = fStack_44 - radius;
  fStack_80 = 0.0 - radius;
  fStack_7c = 0.0 - radius;
  local_48 = radius + local_48;
  fStack_44 = radius + fStack_44;
  fStack_40 = radius + 0.0;
  fStack_3c = radius + 0.0;
  local_78 = radius;
  local_38.Min.x = local_88;
  local_38.Min.y = fStack_84;
  local_38.Max.x = local_48;
  local_38.Max.y = fStack_44;
  bVar7 = ItemAdd(&local_38,id,(ImRect *)0x0);
  bVar8 = ButtonBehavior(&local_38,id,&local_91,&local_92,0);
  if (bVar7) {
    local_90.x = (local_88 + local_48) * 0.5;
    local_90.y = (fStack_84 + fStack_44) * 0.5;
    fVar10 = (fStack_80 + fStack_40) * 0.0;
    fVar11 = (fStack_7c + fStack_3c) * 0.0;
    if (local_91 == true) {
      this = pIVar2->DrawList;
      local_88 = 2.0;
      if (2.0 <= local_78) {
        local_88 = local_78;
      }
      pIVar1 = (GImGui->Style).Colors + (ulong)local_92 + 0x16;
      local_68.x = pIVar1->x;
      local_68.y = pIVar1->y;
      uVar3 = pIVar1->z;
      uVar4 = pIVar1->w;
      local_68.w = (GImGui->Style).Alpha * (float)uVar4;
      local_68.z = (float)uVar3;
      IVar9 = ColorConvertFloat4ToU32(&local_68);
      ImDrawList::AddCircleFilled(this,&local_90,local_88,IVar9,9);
      fVar10 = 0.0;
      fVar11 = 0.0;
    }
    local_78 = local_78 * 0.7071 + -1.0;
    local_68.x = (GImGui->Style).Colors[0].x;
    local_68.y = (GImGui->Style).Colors[0].y;
    uVar5 = (GImGui->Style).Colors[0].z;
    uVar6 = (GImGui->Style).Colors[0].w;
    local_68.w = (GImGui->Style).Alpha * (float)uVar6;
    local_68.z = (float)uVar5;
    local_88 = local_90.x;
    fStack_84 = local_90.y;
    fStack_80 = fVar10;
    fStack_7c = fVar11;
    IVar9 = ColorConvertFloat4ToU32(&local_68);
    local_90.x = local_88 + -0.5;
    local_90.y = fStack_84 + -0.5;
    local_68.x = local_78 + local_90.x;
    local_68.y = local_78 + local_90.y;
    local_50.y = local_90.y - local_78;
    local_50.x = local_90.x - local_78;
    ImDrawList::AddLine(pIVar2->DrawList,(ImVec2 *)&local_68,&local_50,IVar9,1.0);
    local_68.y = local_90.y - local_78;
    local_68.x = local_78 + local_90.x;
    local_50.y = local_78 + local_90.y;
    local_50.x = local_90.x - local_78;
    ImDrawList::AddLine(pIVar2->DrawList,(ImVec2 *)&local_68,&local_50,IVar9,1.0);
  }
  return bVar8;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered), 9);

    float cross_extent = (radius * 0.7071f) - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}